

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<std::array<double,2ul>>(Attribute *this,array<double,_2UL> *v)

{
  value_type *pvVar1;
  optional<std::array<double,_2UL>_> local_50;
  undefined1 local_38 [8];
  optional<std::array<double,_2UL>_> ret;
  array<double,_2UL> *v_local;
  Attribute *this_local;
  
  if (v == (array<double,_2UL> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._8_8_ = v;
    primvar::PrimVar::get_value<std::array<double,2ul>>(&local_50,&this->_var);
    nonstd::optional_lite::optional<std::array<double,_2UL>_>::optional<std::array<double,_2UL>,_0>
              ((optional<std::array<double,_2UL>_> *)local_38,&local_50);
    nonstd::optional_lite::optional<std::array<double,_2UL>_>::~optional(&local_50);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_38);
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<std::array<double,_2UL>_>::value
                         ((optional<std::array<double,_2UL>_> *)local_38);
      *(double *)ret.contained._8_8_ = pvVar1->_M_elems[0];
      *(double *)(ret.contained._8_8_ + 8) = pvVar1->_M_elems[1];
    }
    nonstd::optional_lite::optional<std::array<double,_2UL>_>::~optional
              ((optional<std::array<double,_2UL>_> *)local_38);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }